

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::dht_live_nodes(session_impl *this,sha1_hash *nid)

{
  dht_tracker *this_00;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  nodes;
  _Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_30;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    libtorrent::dht::dht_tracker::live_nodes
              ((vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                *)&local_30,this_00,nid);
    alert_manager::
    emplace_alert<libtorrent::dht_live_nodes_alert,libtorrent::digest32<160l>const&,std::vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>&>
              (&this->m_alerts,nid,
               (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                *)&local_30);
    ::std::
    _Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
    ::~_Vector_base(&local_30);
  }
  return;
}

Assistant:

void session_impl::dht_live_nodes(sha1_hash const& nid)
	{
		if (!m_dht) return;
		auto nodes = m_dht->live_nodes(nid);
		m_alerts.emplace_alert<dht_live_nodes_alert>(nid, nodes);
	}